

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int SaveEXR(float *data,int width,int height,int components,int save_as_fp16,char *outfilename,
           char **err)

{
  value_type vVar1;
  ostream *poVar2;
  float *__dest;
  reference pvVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  void *in_RDI;
  int in_R8D;
  int ret;
  int i_1;
  float *image_ptr [4];
  size_t i;
  vector<float,_std::allocator<float>_> images [4];
  EXRImage image;
  EXRHeader header;
  stringstream ss;
  char **in_stack_fffffffffffffc28;
  string *in_stack_fffffffffffffc30;
  EXRImage *pEVar4;
  EXRImage *this;
  undefined4 in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffc50;
  EXRImage *local_340;
  int local_31c;
  reference local_318;
  reference local_310;
  reference local_308;
  reference local_300;
  ulong local_2f0;
  EXRImage local_2e8;
  char **in_stack_fffffffffffffd40;
  pointer in_stack_fffffffffffffd48;
  EXRHeader *in_stack_fffffffffffffd50;
  EXRImage *in_stack_fffffffffffffd58;
  vector<float,_std::allocator<float>_> local_2a0;
  EXRImage local_288 [4];
  char *local_200;
  void *local_1f8;
  int local_1f0;
  undefined4 local_1ec;
  void *local_1e8;
  string local_1e0 [48];
  stringstream local_1b0 [16];
  ostream local_1a0 [384];
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  void *local_10;
  int local_4;
  
  local_1c = in_ECX;
  if (((in_ECX == 1) || (in_ECX == 3)) || (in_ECX == 4)) {
    local_20 = in_R8D;
    local_18 = in_EDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    InitEXRHeader((EXRHeader *)0x1ede1c);
    if ((local_14 < 0x10) && (local_18 < 0x10)) {
      local_1ec = 0;
    }
    else {
      local_1ec = 3;
    }
    InitEXRImage(local_288);
    local_288[0].num_channels = local_1c;
    local_340 = &local_2e8;
    do {
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x1ede97);
      local_340 = (EXRImage *)&local_340->num_channels;
    } while (local_340 != local_288);
    if (local_1c == 1) {
      std::vector<float,_std::allocator<float>_>::resize
                (in_stack_fffffffffffffc50,
                 CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      __dest = std::vector<float,_std::allocator<float>_>::data
                         ((vector<float,_std::allocator<float>_> *)0x1edef6);
      memcpy(__dest,local_10,(long)(local_14 * local_18) << 2);
    }
    else {
      std::vector<float,_std::allocator<float>_>::resize
                (in_stack_fffffffffffffc50,
                 CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      std::vector<float,_std::allocator<float>_>::resize
                (in_stack_fffffffffffffc50,
                 CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      std::vector<float,_std::allocator<float>_>::resize
                (in_stack_fffffffffffffc50,
                 CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      std::vector<float,_std::allocator<float>_>::resize
                (in_stack_fffffffffffffc50,
                 CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      for (local_2f0 = 0; local_2f0 < (ulong)(long)(local_14 * local_18); local_2f0 = local_2f0 + 1)
      {
        vVar1 = *(value_type *)((long)local_10 + (long)local_1c * local_2f0 * 4);
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)&local_2e8,local_2f0);
        *pvVar3 = vVar1;
        vVar1 = *(value_type *)((long)local_10 + (long)local_1c * local_2f0 * 4 + 4);
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)&local_2e8.num_channels,
                            local_2f0);
        *pvVar3 = vVar1;
        vVar1 = *(value_type *)((long)local_10 + (long)local_1c * local_2f0 * 4 + 8);
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffffffd48,
                            local_2f0);
        *pvVar3 = vVar1;
        if (local_1c == 4) {
          vVar1 = *(value_type *)((long)local_10 + local_2f0 * 0x10 + 0xc);
          pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_2a0,local_2f0);
          *pvVar3 = vVar1;
        }
      }
    }
    memset(&local_318,0,0x20);
    if (local_1c == 4) {
      local_318 = std::vector<float,_std::allocator<float>_>::at
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc30,
                             (size_type)in_stack_fffffffffffffc28);
      local_310 = std::vector<float,_std::allocator<float>_>::at
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc30,
                             (size_type)in_stack_fffffffffffffc28);
      local_308 = std::vector<float,_std::allocator<float>_>::at
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc30,
                             (size_type)in_stack_fffffffffffffc28);
      local_300 = std::vector<float,_std::allocator<float>_>::at
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc30,
                             (size_type)in_stack_fffffffffffffc28);
    }
    else if (local_1c == 3) {
      local_318 = std::vector<float,_std::allocator<float>_>::at
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc30,
                             (size_type)in_stack_fffffffffffffc28);
      local_310 = std::vector<float,_std::allocator<float>_>::at
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc30,
                             (size_type)in_stack_fffffffffffffc28);
      local_308 = std::vector<float,_std::allocator<float>_>::at
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc30,
                             (size_type)in_stack_fffffffffffffc28);
    }
    else if (local_1c == 1) {
      local_318 = std::vector<float,_std::allocator<float>_>::at
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc30,
                             (size_type)in_stack_fffffffffffffc28);
    }
    local_288[0].images = (uchar **)&local_318;
    local_288[0].width = local_14;
    local_288[0].height = local_18;
    local_1f0 = local_1c;
    local_200 = (char *)malloc((long)local_1c * 0x110);
    if (local_1c == 4) {
      strncpy(local_200,"A",0xff);
      strncpy(local_200 + 0x110,"B",0xff);
      strncpy(local_200 + 0x220,"G",0xff);
      strncpy(local_200 + 0x330,"R",0xff);
      local_200[1] = '\0';
      local_200[0x111] = '\0';
      local_200[0x221] = '\0';
      local_200[0x331] = '\0';
    }
    else if (local_1c == 3) {
      strncpy(local_200,"B",0xff);
      strncpy(local_200 + 0x110,"G",0xff);
      strncpy(local_200 + 0x220,"R",0xff);
      local_200[1] = '\0';
      local_200[0x111] = '\0';
      local_200[0x221] = '\0';
    }
    else {
      strncpy(local_200,"A",0xff);
      local_200[1] = '\0';
    }
    local_1f8 = malloc((long)local_1f0 << 2);
    local_1e8 = malloc((long)local_1f0 << 2);
    for (local_31c = 0; local_31c < local_1f0; local_31c = local_31c + 1) {
      *(undefined4 *)((long)local_1f8 + (long)local_31c * 4) = 2;
      if (local_20 < 1) {
        *(undefined4 *)((long)local_1e8 + (long)local_31c * 4) = 2;
      }
      else {
        *(undefined4 *)((long)local_1e8 + (long)local_31c * 4) = 1;
      }
    }
    local_4 = SaveEXRImageToFile(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                                 (char *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    if (local_4 == 0) {
      free(local_200);
      free(local_1f8);
      free(local_1e8);
    }
    this = local_288;
    do {
      pEVar4 = (EXRImage *)&this[-1].images;
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)this);
      this = pEVar4;
    } while (pEVar4 != &local_2e8);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar2 = std::operator<<(local_1a0,"Unsupported component value : ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::stringstream::str();
    tinyexr::SetErrorMessage(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    std::__cxx11::string::~string(local_1e0);
    local_4 = -3;
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  return local_4;
}

Assistant:

int SaveEXR(const float *data, int width, int height, int components,
            const int save_as_fp16, const char *outfilename, const char **err) {
  if ((components == 1) || components == 3 || components == 4) {
    // OK
  } else {
    std::stringstream ss;
    ss << "Unsupported component value : " << components << std::endl;

    tinyexr::SetErrorMessage(ss.str(), err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRHeader header;
  InitEXRHeader(&header);

  if ((width < 16) && (height < 16)) {
    // No compression for small image.
    header.compression_type = TINYEXR_COMPRESSIONTYPE_NONE;
  } else {
    header.compression_type = TINYEXR_COMPRESSIONTYPE_ZIP;
  }

  EXRImage image;
  InitEXRImage(&image);

  image.num_channels = components;

  std::vector<float> images[4];

  if (components == 1) {
    images[0].resize(static_cast<size_t>(width * height));
    memcpy(images[0].data(), data, sizeof(float) * size_t(width * height));
  } else {
    images[0].resize(static_cast<size_t>(width * height));
    images[1].resize(static_cast<size_t>(width * height));
    images[2].resize(static_cast<size_t>(width * height));
    images[3].resize(static_cast<size_t>(width * height));

    // Split RGB(A)RGB(A)RGB(A)... into R, G and B(and A) layers
    for (size_t i = 0; i < static_cast<size_t>(width * height); i++) {
      images[0][i] = data[static_cast<size_t>(components) * i + 0];
      images[1][i] = data[static_cast<size_t>(components) * i + 1];
      images[2][i] = data[static_cast<size_t>(components) * i + 2];
      if (components == 4) {
        images[3][i] = data[static_cast<size_t>(components) * i + 3];
      }
    }
  }

  float *image_ptr[4] = {0, 0, 0, 0};
  if (components == 4) {
    image_ptr[0] = &(images[3].at(0));  // A
    image_ptr[1] = &(images[2].at(0));  // B
    image_ptr[2] = &(images[1].at(0));  // G
    image_ptr[3] = &(images[0].at(0));  // R
  } else if (components == 3) {
    image_ptr[0] = &(images[2].at(0));  // B
    image_ptr[1] = &(images[1].at(0));  // G
    image_ptr[2] = &(images[0].at(0));  // R
  } else if (components == 1) {
    image_ptr[0] = &(images[0].at(0));  // A
  }

  image.images = reinterpret_cast<unsigned char **>(image_ptr);
  image.width = width;
  image.height = height;

  header.num_channels = components;
  header.channels = static_cast<EXRChannelInfo *>(malloc(
      sizeof(EXRChannelInfo) * static_cast<size_t>(header.num_channels)));
  // Must be (A)BGR order, since most of EXR viewers expect this channel order.
  if (components == 4) {
#ifdef _MSC_VER
    strncpy_s(header.channels[0].name, "A", 255);
    strncpy_s(header.channels[1].name, "B", 255);
    strncpy_s(header.channels[2].name, "G", 255);
    strncpy_s(header.channels[3].name, "R", 255);
#else
    strncpy(header.channels[0].name, "A", 255);
    strncpy(header.channels[1].name, "B", 255);
    strncpy(header.channels[2].name, "G", 255);
    strncpy(header.channels[3].name, "R", 255);
#endif
    header.channels[0].name[strlen("A")] = '\0';
    header.channels[1].name[strlen("B")] = '\0';
    header.channels[2].name[strlen("G")] = '\0';
    header.channels[3].name[strlen("R")] = '\0';
  } else if (components == 3) {
#ifdef _MSC_VER
    strncpy_s(header.channels[0].name, "B", 255);
    strncpy_s(header.channels[1].name, "G", 255);
    strncpy_s(header.channels[2].name, "R", 255);
#else
    strncpy(header.channels[0].name, "B", 255);
    strncpy(header.channels[1].name, "G", 255);
    strncpy(header.channels[2].name, "R", 255);
#endif
    header.channels[0].name[strlen("B")] = '\0';
    header.channels[1].name[strlen("G")] = '\0';
    header.channels[2].name[strlen("R")] = '\0';
  } else {
#ifdef _MSC_VER
    strncpy_s(header.channels[0].name, "A", 255);
#else
    strncpy(header.channels[0].name, "A", 255);
#endif
    header.channels[0].name[strlen("A")] = '\0';
  }

  header.pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(header.num_channels)));
  header.requested_pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(header.num_channels)));
  for (int i = 0; i < header.num_channels; i++) {
    header.pixel_types[i] =
        TINYEXR_PIXELTYPE_FLOAT;  // pixel type of input image

    if (save_as_fp16 > 0) {
      header.requested_pixel_types[i] =
          TINYEXR_PIXELTYPE_HALF;  // save with half(fp16) pixel format
    } else {
      header.requested_pixel_types[i] =
          TINYEXR_PIXELTYPE_FLOAT;  // save with float(fp32) pixel format(i.e.
                                    // no precision reduction)
    }
  }

  int ret = SaveEXRImageToFile(&image, &header, outfilename, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  free(header.channels);
  free(header.pixel_types);
  free(header.requested_pixel_types);

  return ret;
}